

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

BinOp LLVMBC::translate_atomic_binop(AtomicBinOp op)

{
  BinOp local_c;
  AtomicBinOp op_local;
  
  switch(op) {
  case RMW_XCHG:
    local_c = Xchg;
    break;
  case RMW_ADD:
    local_c = Add;
    break;
  case RMW_SUB:
    local_c = Sub;
    break;
  case RMW_AND:
    local_c = And;
    break;
  case RMW_NAND:
    local_c = Nand;
    break;
  case RMW_OR:
    local_c = Or;
    break;
  case RMW_XOR:
    local_c = Xor;
    break;
  case RMW_MAX:
    local_c = Max;
    break;
  case RMW_MIN:
    local_c = Min;
    break;
  case RMW_UMAX:
    local_c = UMax;
    break;
  case RMW_UMIN:
    local_c = UMin;
    break;
  case RMW_FADD:
    local_c = FAdd;
    break;
  case RMW_FSUB:
    local_c = FSub;
    break;
  default:
    local_c = Invalid;
  }
  return local_c;
}

Assistant:

static AtomicRMWInst::BinOp translate_atomic_binop(AtomicBinOp op)
{
	switch (op)
	{
	case AtomicBinOp::RMW_XCHG:
		return AtomicRMWInst::BinOp::Xchg;
	case AtomicBinOp::RMW_ADD:
		return AtomicRMWInst::BinOp::Add;
	case AtomicBinOp::RMW_SUB:
		return AtomicRMWInst::BinOp::Sub;
	case AtomicBinOp::RMW_AND:
		return AtomicRMWInst::BinOp::And;
	case AtomicBinOp::RMW_NAND:
		return AtomicRMWInst::BinOp::Nand;
	case AtomicBinOp::RMW_OR:
		return AtomicRMWInst::BinOp::Or;
	case AtomicBinOp::RMW_XOR:
		return AtomicRMWInst::BinOp::Xor;
	case AtomicBinOp::RMW_MAX:
		return AtomicRMWInst::BinOp::Max;
	case AtomicBinOp::RMW_MIN:
		return AtomicRMWInst::BinOp::Min;
	case AtomicBinOp::RMW_UMAX:
		return AtomicRMWInst::BinOp::UMax;
	case AtomicBinOp::RMW_UMIN:
		return AtomicRMWInst::BinOp::UMin;
	case AtomicBinOp::RMW_FADD:
		return AtomicRMWInst::BinOp::FAdd;
	case AtomicBinOp::RMW_FSUB:
		return AtomicRMWInst::BinOp::FSub;
	default:
		return AtomicRMWInst::BinOp::Invalid;
	}
}